

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysc_must * lysc_node_musts(lysc_node *node)

{
  lysc_must **pplVar1;
  lysc_must *plVar2;
  
  pplVar1 = lysc_node_musts_p(node);
  if (pplVar1 == (lysc_must **)0x0) {
    plVar2 = (lysc_must *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

lysc_must *
lysc_node_musts(const struct lysc_node *node)
{
    struct lysc_must **must_p;

    must_p = lysc_node_musts_p(node);
    if (must_p) {
        return *must_p;
    } else {
        return NULL;
    }
}